

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

void outputChar(char c,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  int local_2c;
  int32_t i;
  int32_t indent_local;
  int32_t capacity_local;
  int32_t *outIx_local;
  char *outBuf_local;
  char c_local;
  
  if (((*outIx == 0) ||
      ((((c != '\n' && (c != '\0')) && (*outIx < capacity)) && (outBuf[*outIx + -1] == '\n')))) ||
     ((c == '\n' && (capacity <= *outIx)))) {
    for (local_2c = 0; local_2c < indent; local_2c = local_2c + 1) {
      if (*outIx < capacity) {
        outBuf[*outIx] = ' ';
      }
      *outIx = *outIx + 1;
    }
  }
  if (*outIx < capacity) {
    outBuf[*outIx] = c;
  }
  if (c != '\0') {
    *outIx = *outIx + 1;
  }
  return;
}

Assistant:

static void outputChar(char c, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i;
    /* Check whether a start of line indenting is needed.  Three cases:
     *   1.  At the start of the first line  (output index == 0).
     *   2.  At the start of subsequent lines  (preceeding char in buffer == '\n')
     *   3.  When preflighting buffer len (buffer capacity is exceeded), when
     *       a \n is output.  Ideally we wouldn't do the indent until the following char
     *       is received, but that won't work because there's no place to remember that
     *       the preceding char was \n.  Meaning that we may overstimate the
     *       buffer size needed.  No harm done.
     */
    if (*outIx==0 ||   /* case 1. */
        (c!='\n' && c!=0 && *outIx < capacity && outBuf[(*outIx)-1]=='\n') ||  /* case 2. */
        (c=='\n' && *outIx>=capacity))    /* case 3 */
    {
        /* At the start of a line.  Indent. */
        for(i=0; i<indent; i++) {
            if (*outIx < capacity) {
                outBuf[*outIx] = ' ';
            }
            (*outIx)++;
        }
    }

    if (*outIx < capacity) {
        outBuf[*outIx] = c;
    }
    if (c != 0) {
        /* Nulls only appear as end-of-string terminators.  Move them to the output
         *  buffer, but do not update the length of the buffer, so that any
         *  following output will overwrite the null. */
        (*outIx)++;
    }
}